

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int spiRead(uint handle,char *buf,uint count)

{
  char *pcVar1;
  uint in_EDX;
  uint in_EDI;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  FILE *pFVar2;
  char *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  uint local_4;
  
  pFVar2 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar1 = myTimeStamp();
    in_stack_ffffffffffffffa8 =
         myBuf2Str((uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20),in_stack_ffffffffffffffa8);
    fprintf(pFVar2,"%s %s: handle=%d count=%d [%s]\n",pcVar1,"spiRead",(ulong)in_EDI,(ulong)in_EDX);
  }
  pFVar2 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar1 = myTimeStamp();
      fprintf(pFVar2,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar1,"spiRead");
    }
    local_4 = 0xffffffe1;
  }
  else if (in_EDI < 0x20) {
    if (spiInfo[in_EDI].state == 2) {
      if (in_EDX < 0x10001) {
        spiGo((uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(uint32_t)in_stack_ffffffffffffffc0,
              in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
              (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
        local_4 = in_EDX;
      }
      else {
        if ((gpioCfg.internals & 0x400) == 0) {
          pcVar1 = myTimeStamp();
          fprintf(pFVar2,"%s %s: bad count (%d)\n",pcVar1,"spiRead",(ulong)in_EDX);
        }
        local_4 = 0xffffffac;
      }
    }
    else {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar1 = myTimeStamp();
        fprintf(pFVar2,"%s %s: bad handle (%d)\n",pcVar1,"spiRead",(ulong)in_EDI);
      }
      local_4 = 0xffffffe7;
    }
  }
  else {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar1 = myTimeStamp();
      fprintf(pFVar2,"%s %s: bad handle (%d)\n",pcVar1,"spiRead",(ulong)in_EDI);
    }
    local_4 = 0xffffffe7;
  }
  return local_4;
}

Assistant:

int spiRead(unsigned handle, char *buf, unsigned count)
{
   DBG(DBG_USER, "handle=%d count=%d [%s]",
      handle, count, myBuf2Str(count, buf));

   CHECK_INITED;

   if (handle >= PI_SPI_SLOTS)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (spiInfo[handle].state != PI_SPI_OPENED)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (count > PI_MAX_SPI_DEVICE_COUNT)
      SOFT_ERROR(PI_BAD_SPI_COUNT, "bad count (%d)", count);

   spiGo(spiInfo[handle].speed, spiInfo[handle].flags, NULL, buf, count);

   return count;
}